

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSecondaryViewConfigurationLayerInfoMSFT *value)

{
  XrEnvironmentBlendMode XVar1;
  XrStructureType XVar2;
  XrCompositionLayerEquirect2KHR *value_00;
  bool bVar3;
  NextChainResult NVar4;
  XrResult XVar5;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var6;
  uint __val;
  ulong uVar7;
  string asStack_3c8 [4];
  uint32_t in_stack_fffffffffffffc3c;
  allocator local_39a;
  allocator local_399;
  string local_398;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_198;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_180;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_168;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_150;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_138;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_108;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar5 = XR_SUCCESS;
  if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSecondaryViewConfigurationLayerInfoMSFT",
               value->type,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type",
               XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT,
               "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
  }
  if (!check_pnext) goto LAB_00163a0a;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar4 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)asStack_3c8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_((string *)asStack_3c8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string(asStack_3c8);
    std::__cxx11::string::string
              (asStack_3c8,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique",&local_39a);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    std::__cxx11::string::string
              ((string *)&local_398,
               "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct"
               ,&local_399);
    CoreValidLogMessage(instance_info,(string *)asStack_3c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string(asStack_3c8);
LAB_001639d9:
    std::__cxx11::string::~string((string *)&error_message);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar4 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next",
               (allocator *)&local_398);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              (asStack_3c8,
               "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\""
               ,&local_39a);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,(string *)asStack_3c8);
    std::__cxx11::string::~string(asStack_3c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_001639d9;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_00163a0a:
  if (!check_members || XVar5 != XR_SUCCESS) {
    return XVar5;
  }
  std::__cxx11::string::string
            ((string *)&error_message,"XrSecondaryViewConfigurationLayerInfoMSFT",
             (allocator *)&local_398);
  std::__cxx11::string::string(asStack_3c8,"viewConfigurationType",(allocator *)&valid_ext_structs);
  bVar3 = ValidateXrEnum(instance_info,command_name,&error_message,(string *)asStack_3c8,
                         objects_info,value->viewConfigurationType);
  std::__cxx11::string::~string(asStack_3c8);
  std::__cxx11::string::~string((string *)&error_message);
  if (bVar3) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrSecondaryViewConfigurationLayerInfoMSFT",
               (allocator *)&local_398);
    std::__cxx11::string::string(asStack_3c8,"environmentBlendMode",(allocator *)&valid_ext_structs)
    ;
    XVar1 = value->environmentBlendMode;
    std::__cxx11::string::~string(asStack_3c8);
    std::__cxx11::string::~string((string *)&error_message);
    if (XVar1 - XR_ENVIRONMENT_BLEND_MODE_OPAQUE < 3) {
      XVar5 = XR_SUCCESS;
      if ((value->layerCount == 0) && (value->layers != (XrCompositionLayerBaseHeader **)0x0)) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength",
                   (allocator *)&local_398);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_c0,objects_info);
        std::__cxx11::string::string
                  (asStack_3c8,
                   "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_c0,(string *)asStack_3c8);
        std::__cxx11::string::~string(asStack_3c8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_c0);
        std::__cxx11::string::~string((string *)&error_message);
        XVar5 = XR_ERROR_VALIDATION_FAILURE;
      }
      if (value->layers == (XrCompositionLayerBaseHeader **)0x0) {
        if (value->layerCount == 0) {
          return XVar5;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                   (allocator *)&local_398);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_d8,objects_info);
        std::__cxx11::string::string
                  (asStack_3c8,
                   "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not optional since \"layerCount\" is set and must be non-NULL"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_d8,(string *)asStack_3c8);
        std::__cxx11::string::~string(asStack_3c8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_d8);
      }
      else {
        uVar7 = 0;
        while( true ) {
          if (value->layerCount <= uVar7) {
            return XVar5;
          }
          value_00 = (XrCompositionLayerEquirect2KHR *)value->layers[uVar7];
          __val = (uint)uVar7;
          if (value_00 == (XrCompositionLayerEquirect2KHR *)0x0) break;
          XVar2 = value_00->type;
          if (XVar2 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerPassthroughHTC *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_1b0,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_1b0,&error_message);
              p_Var6 = &local_1b0;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_QUAD) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerQuad *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_120,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_120,&error_message);
              p_Var6 = &local_120;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerCubeKHR *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_138,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_138,&error_message);
              p_Var6 = &local_138;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerCylinderKHR *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_150,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_150,&error_message);
              p_Var6 = &local_150;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerEquirectKHR *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_168,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_168,&error_message);
              p_Var6 = &local_168;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_180,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_180,&error_message);
              p_Var6 = &local_180;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerPassthroughFB *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_198,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_198,&error_message);
              p_Var6 = &local_198;
              goto LAB_00163fa9;
            }
          }
          else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                     (XrCompositionLayerProjection *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                         (allocator *)asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::to_string((string *)asStack_3c8,__val);
              std::__cxx11::string::append((string *)&error_message);
              std::__cxx11::string::~string(asStack_3c8);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_108,objects_info);
              CoreValidLogMessage(instance_info,(string *)asStack_3c8,
                                  VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_108,&error_message);
              p_Var6 = &local_108;
              goto LAB_00163fa9;
            }
          }
          else {
            XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                                     (XrCompositionLayerBaseHeader *)value_00);
            if (XVar5 != XR_SUCCESS) {
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                         (allocator *)&local_398);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_1c8,objects_info);
              std::__cxx11::string::string
                        (asStack_3c8,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid"
                         ,(allocator *)&valid_ext_structs);
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_1c8,(string *)asStack_3c8);
              std::__cxx11::string::~string(asStack_3c8);
              std::
              _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~_Vector_base(&local_1c8);
              std::__cxx11::string::~string((string *)&error_message);
              return XVar5;
            }
          }
          uVar7 = uVar7 + 1;
          XVar5 = XR_SUCCESS;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                   (allocator *)asStack_3c8);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::to_string((string *)asStack_3c8,__val);
        std::__cxx11::string::append((string *)&error_message);
        std::__cxx11::string::~string(asStack_3c8);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  (asStack_3c8,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                   (allocator *)&local_398);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_f0,objects_info);
        CoreValidLogMessage(instance_info,(string *)asStack_3c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_f0,&error_message);
        p_Var6 = &local_f0;
LAB_00163fa9:
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(p_Var6);
        std::__cxx11::string::~string(asStack_3c8);
      }
      std::__cxx11::string::~string((string *)&error_message);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffc3c);
    std::operator<<((ostream *)&error_message,asStack_3c8);
    std::__cxx11::string::~string(asStack_3c8);
    std::__cxx11::string::string
              (asStack_3c8,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_a8,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,(string *)asStack_3c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_a8,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    p_Var6 = &local_a8;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffc3c);
    std::operator<<((ostream *)&error_message,asStack_3c8);
    std::__cxx11::string::~string(asStack_3c8);
    std::__cxx11::string::string
              (asStack_3c8,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_90,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,(string *)asStack_3c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_90,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    p_Var6 = &local_90;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var6);
  std::__cxx11::string::~string(asStack_3c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSecondaryViewConfigurationLayerInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSecondaryViewConfigurationLayerInfoMSFT",
                             value->type, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type", XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT, "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSecondaryViewConfigurationLayerInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrViewConfigurationType value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "viewConfigurationType", objects_info, value->viewConfigurationType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->viewConfigurationType));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->layerCount && nullptr != value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->layers && 0 != value->layerCount) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not "
                            "optional since \"layerCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, value->layers[value_layers_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}